

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall DynamicGraph::printInfo(DynamicGraph *this)

{
  bool bVar1;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *psVar2;
  ostream *poVar3;
  void *pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference peVar7;
  unsigned_long uVar8;
  size_type sVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_150;
  undefined1 local_130 [8];
  Edge e_2;
  Vertex w_2;
  Vertex u_2;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *ei_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *__range2_2;
  unsigned_long local_e0;
  property_type *local_d8;
  undefined1 local_c8 [8];
  Edge e_1;
  Vertex w_1;
  Vertex u_1;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *ei_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *__range2_1;
  unsigned_long local_78;
  property_type *local_70;
  undefined1 local_60 [8];
  Edge e;
  Vertex w;
  Vertex u;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *ei;
  iterator __end2;
  iterator __begin2;
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *__range2;
  Vertex v;
  DynamicGraph *this_local;
  
  __range2 = (set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              *)0x0;
  while( true ) {
    psVar2 = (set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->level);
    if (psVar2 <= __range2) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Vertex ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(ulong)__range2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout," - component ");
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->components,(size_type)__range2);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout," - level ");
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->level,(size_type)__range2);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout," - pred: ");
    pvVar6 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)__range2);
    __end2 = std::
             set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             ::begin(&pvVar6->a_pred);
    ei = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
         std::
         set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end(&pvVar6->a_pred);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&ei);
      if (!bVar1) break;
      peVar7 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&__end2);
      uVar8 = boost::
              source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                        (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                         &this->super_UndirectedGraph);
      e.m_eproperty =
           (property_type *)
           boost::
           target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                     (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                      &this->super_UndirectedGraph);
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *)
                 &__range2_1,(boost *)e.m_eproperty,uVar8,(vertex_descriptor)this,in_R8);
      local_60 = (undefined1  [8])__range2_1;
      e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = local_78;
      e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = (unsigned_long)local_70;
      sVar9 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(&this->virtualEdges,(key_type *)local_60);
      if (sVar9 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar10 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_60);
      std::operator<<(pbVar10," ");
      std::
      _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout," - sibl: ");
    pvVar6 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)__range2);
    __end2_1 = std::
               set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               ::begin(&pvVar6->b_sibl);
    ei_1 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
           std::
           set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           ::end(&pvVar6->b_sibl);
    while( true ) {
      bVar1 = std::operator!=(&__end2_1,(_Self *)&ei_1);
      if (!bVar1) break;
      peVar7 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&__end2_1);
      uVar8 = boost::
              source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                        (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                         &this->super_UndirectedGraph);
      e_1.m_eproperty =
           (property_type *)
           boost::
           target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                     (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                      &this->super_UndirectedGraph);
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *)
                 &__range2_2,(boost *)e_1.m_eproperty,uVar8,(vertex_descriptor)this,in_R8);
      local_c8 = (undefined1  [8])__range2_2;
      e_1.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = local_e0;
      e_1.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = (unsigned_long)local_d8;
      sVar9 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(&this->virtualEdges,(key_type *)local_c8);
      if (sVar9 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar10 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_c8);
      std::operator<<(pbVar10," ");
      std::
      _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
      ::operator++(&__end2_1);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout," - succ: ");
    pvVar6 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,(size_type)__range2);
    __end2_2 = std::
               set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
               ::begin(&pvVar6->c_succ);
    ei_2 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
           std::
           set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           ::end(&pvVar6->c_succ);
    while( true ) {
      bVar1 = std::operator!=(&__end2_2,(_Self *)&ei_2);
      if (!bVar1) break;
      peVar7 = std::
               _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
               ::operator*(&__end2_2);
      uVar8 = boost::
              source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                        (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                         &this->super_UndirectedGraph);
      e_2.m_eproperty =
           (property_type *)
           boost::
           target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                     (&peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>,
                      &this->super_UndirectedGraph);
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_150,(boost *)e_2.m_eproperty,uVar8,(vertex_descriptor)this,in_R8);
      local_130 = (undefined1  [8])
                  local_150.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      e_2.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_150.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      e_2.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           (unsigned_long)local_150.first.m_eproperty;
      sVar9 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(&this->virtualEdges,(key_type *)local_130);
      if (sVar9 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar10 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_130);
      std::operator<<(pbVar10," ");
      std::
      _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
      ::operator++(&__end2_2);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    __range2 = (set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&(__range2->_M_t)._M_impl.field_0x1;
  }
  return;
}

Assistant:

void DynamicGraph::printInfo() const
{
    for (Vertex v = 0; v < this->level.size(); v++) {
        std::cout << "Vertex " << v  << std::endl;
        std::cout << " - component " << this->components[v] << std::endl;
        std::cout << " - level " << this->level[v] << std::endl;
        std::cout << " - pred: ";
        for (const auto &ei : this->relatives[v].a_pred) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
        std::cout << " - sibl: ";
        for (const auto &ei : this->relatives[v].b_sibl) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
        std::cout << " - succ: ";
        for (const auto &ei : this->relatives[v].c_succ) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
    }
}